

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

string * __thiscall
ArrayType::sizeToString_abi_cxx11_(string *__return_storage_ptr__,ArrayType *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint __val;
  ArrayType *this_00;
  bool bVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  string __str;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  __val = this->size;
  cVar4 = '\x01';
  if (9 < __val) {
    uVar5 = __val;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar5 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0015c731;
      }
      if (uVar5 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0015c731;
      }
      if (uVar5 < 10000) goto LAB_0015c731;
      bVar2 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_0015c731:
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_48._M_dataplus._M_p,(uint)local_48._M_string_length,__val);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  this_00 = (ArrayType *)this->type;
  if ((this_00 != (ArrayType *)0x0) && ((this_00->super_Type).kind == TK_ArrayType)) {
    sizeToString_abi_cxx11_(&local_48,this_00);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ArrayType::sizeToString() const {
    std::string ret;

    ret += "[";
    ret += std::to_string(size);
    ret += "]";
    if (ArrayType* AT = llvm::dyn_cast_or_null<ArrayType>(type)) {
        ret += AT->sizeToString();
    }

    return ret;
}